

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeader.cpp
# Opt level: O2

FieldType __thiscall HttpFieldMap::getFieldType(HttpFieldMap *this,char *field)

{
  int iVar1;
  FieldType FVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = 1000;
  lVar4 = 0;
  while ((FVar2 = -1, lVar4 != 0x178 &&
         (iVar1 = strcasecmp(field,*(char **)((long)gFieldTypeList + lVar4)), FVar2 = iVar3,
         iVar1 != 0))) {
    iVar3 = iVar3 + 1;
    lVar4 = lVar4 + 8;
  }
  return FVar2;
}

Assistant:

FieldMap::FieldType HttpFieldMap::getFieldType(const char *field) const
{
	TRACE_BEGIN(LOG_LVL_NOISE);
	
	for (int i = 0; i < kNumFields - FieldMap::kHttpFieldMapStart; ++i)
	{
		if (strcasecmp(field, gFieldTypeList[i]) == 0)
		{
			LOG("type %d, name %s",
				i+FieldMap::kHttpFieldMapStart, gFieldTypeList[i]);
			return (FieldMap::FieldType)i + FieldMap::kHttpFieldMapStart;
		}
	}
	return FieldMap::kInvalidFieldType;
}